

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O1

void Cmd_RunAutoTunerPrintOptions(satoko_opts_t *pOpts)

{
  printf("-C %d  ",(ulong)(uint)pOpts->conf_limit);
  printf("-V %.3f  ",(double)(float)pOpts->var_decay);
  printf("-W %.3f  ",(double)pOpts->clause_decay);
  if (pOpts->verbose != '\0') {
    printf("-v");
  }
  putchar(10);
  return;
}

Assistant:

void Cmd_RunAutoTunerPrintOptions( satoko_opts_t * pOpts )
{
    printf( "-C %d  ",   (int)pOpts->conf_limit );
    printf( "-V %.3f  ", (float)pOpts->var_decay );
    printf( "-W %.3f  ", (float)pOpts->clause_decay );
    if ( pOpts->verbose )
        printf( "-v" );
    printf( "\n" );
}